

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Scan.h
# Opt level: O1

void __thiscall
Scanner<UTF8EncodingPolicyBase<false>_>::TemporaryBuffer::Grow(TemporaryBuffer *this)

{
  uint uVar1;
  OLECHAR *src;
  code *pcVar2;
  bool bVar3;
  undefined4 *puVar4;
  OLECHAR *dst;
  ulong __size;
  
  if (this->m_pscanner == (Scanner<UTF8EncodingPolicyBase<false>_> *)0x0) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar4 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar4 = 1;
    bVar3 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Parser/Scan.h"
                       ,0x2ab,"(m_pscanner != nullptr)","m_pscanner != nullptr");
    if (!bVar3) {
      pcVar2 = (code *)invalidInstructionException();
      (*pcVar2)();
    }
    *puVar4 = 0;
  }
  uVar1 = this->m_cchMax * 4;
  if (this->m_cchMax < 0x40000000) {
    __size = (ulong)uVar1;
    src = this->m_prgch;
    if (src == (OLECHAR *)this->m_rgbInit) {
      dst = (OLECHAR *)malloc(__size);
      if (dst != (OLECHAR *)0x0) {
        js_memcpy_s(dst,__size,src,(ulong)this->m_ichCur * 2);
        goto LAB_00f159b6;
      }
    }
    else {
      dst = (OLECHAR *)realloc(src,__size);
      if (dst != (OLECHAR *)0x0) {
LAB_00f159b6:
        this->m_prgch = dst;
        this->m_cchMax = uVar1 >> 1;
        return;
      }
    }
  }
  Error(this->m_pscanner,-0x7ff5fc17);
}

Assistant:

void Grow()
        {
            Assert(m_pscanner != nullptr);
            byte *prgbNew;
            byte *prgbOld = (byte *)m_prgch;

            ULONG cbNew;
            if (FAILED(ULongMult(m_cchMax, sizeof(OLECHAR) * 2, &cbNew)))
            {
                m_pscanner->Error(ERRnoMemory);
            }

            if (prgbOld == m_rgbInit)
            {
                if (nullptr == (prgbNew = static_cast<byte*>(malloc(cbNew))))
                    m_pscanner->Error(ERRnoMemory);
                js_memcpy_s(prgbNew, cbNew, prgbOld, m_ichCur * sizeof(OLECHAR));
            }
            else if (nullptr == (prgbNew = static_cast<byte*>(realloc(prgbOld, cbNew))))
            {
                m_pscanner->Error(ERRnoMemory);
            }

            m_prgch = (OLECHAR*)prgbNew;
            m_cchMax = cbNew / sizeof(OLECHAR);
        }